

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

void __thiscall
Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
          (DenseStorage<float,__1,__1,_1,_0> *this,Index size,Index rows,Index param_3)

{
  float *pfVar1;
  
  if (this->m_rows != size) {
    free(this->m_data);
    if (size < 1) {
      pfVar1 = (float *)0x0;
    }
    else {
      pfVar1 = internal::conditional_aligned_new_auto<float,true>(size);
    }
    this->m_data = pfVar1;
  }
  this->m_rows = rows;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void resize(Index size, Index rows, Index)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size>0) // >0 and not simply !=0 to let the compiler knows that size cannot be negative
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
    }